

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  
  pLVar1 = create_layer(7);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,left);
  ParamDict::set(&pd,1,top);
  ParamDict::set(&pd,2,0);
  ParamDict::set(&pd,3,src->w - (right + left));
  ParamDict::set(&pd,4,src->h - (bottom + top));
  ParamDict::set(&pd,5,-0xe9);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, const Option& opt)
{
    ncnn::Layer* crop = ncnn::create_layer(ncnn::LayerType::Crop);

    ncnn::ParamDict pd;
    pd.set(0, left);
    pd.set(1, top);
    pd.set(2, 0);
    pd.set(3, src.w - left - right);
    pd.set(4, src.h - top - bottom);
    pd.set(5, -233);

    crop->load_param(pd);

    crop->forward(src, dst, opt);

    delete crop;
}